

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O0

bool cmFileSet::IsValidName(string *name)

{
  char *string;
  bool bVar1;
  int iVar2;
  undefined1 local_228 [8];
  RegularExpressionMatch match;
  string *name_local;
  
  if (IsValidName(std::__cxx11::string_const&)::regex == '\0') {
    iVar2 = __cxa_guard_acquire(&IsValidName(std::__cxx11::string_const&)::regex);
    if (iVar2 != 0) {
      cmsys::RegularExpression::RegularExpression(&IsValidName::regex,"^[a-z0-9][a-zA-Z0-9_]*$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&IsValidName::regex,&__dso_handle);
      __cxa_guard_release(&IsValidName(std::__cxx11::string_const&)::regex);
    }
  }
  cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)local_228);
  string = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::find
                    (&IsValidName::regex,string,(RegularExpressionMatch *)local_228);
  return bVar1;
}

Assistant:

bool cmFileSet::IsValidName(const std::string& name)
{
  static const cmsys::RegularExpression regex("^[a-z0-9][a-zA-Z0-9_]*$");

  cmsys::RegularExpressionMatch match;
  return regex.find(name.c_str(), match);
}